

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O0

void __thiscall KktCheck::chPrimalBounds(KktCheck *this)

{
  double dVar1;
  reference pvVar2;
  ostream *poVar3;
  reference pvVar4;
  int *in_RDI;
  
  in_RDI[0x44] = 0;
  do {
    if (*in_RDI <= in_RDI[0x44]) {
      return;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                        (long)in_RDI[0x44]);
    dVar1 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),
                        (long)in_RDI[0x44]);
    if (*(double *)(in_RDI + 0x48) <= dVar1 - *pvVar2 &&
        dVar1 - *pvVar2 != *(double *)(in_RDI + 0x48)) {
LAB_001bd54f:
      if (in_RDI[0x58] == 1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Variable ");
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52),(long)in_RDI[0x44])
        ;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
        poVar3 = std::operator<<(poVar3," infeasible: lb=");
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                            (long)in_RDI[0x44]);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar2);
        poVar3 = std::operator<<(poVar3,", vaule=");
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),
                            (long)in_RDI[0x44]);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar2);
        poVar3 = std::operator<<(poVar3,",  ub=");
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                            (long)in_RDI[0x44]);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar2);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      *(undefined1 *)(in_RDI + 0x4a) = 1;
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),
                          (long)in_RDI[0x44]);
      dVar1 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                          (long)in_RDI[0x44]);
      if (*(double *)(in_RDI + 0x48) <= dVar1 - *pvVar2 &&
          dVar1 - *pvVar2 != *(double *)(in_RDI + 0x48)) goto LAB_001bd54f;
    }
    in_RDI[0x44] = in_RDI[0x44] + 1;
  } while( true );
}

Assistant:

void KktCheck::chPrimalBounds() {
	for (i=0; i<numCol;i++) {
		if ((colLower[i] - colValue[i] > tol) ||  (colValue[i]- colUpper[i] > tol) ) {
			if (print == 1) 
				cout<<"Variable "<<cIndexRev[i]<<" infeasible: lb="<<colLower[i]<<", vaule="<<colValue[i]<<",  ub="<<colUpper[i]<<endl;
				//cout<<"Variable "<<i<<" infeasible: lb="<<colLower[i]<<", vaule="<<colValue[i]<<",  ub="<<colUpper[i]<<endl;
			istrueGlb = true;
		}
	}
}